

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * getLinkedTargetsContent<cmLinkImplItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  bool bVar1;
  cmGlobalGenerator *this;
  ulong uVar2;
  cmLocalGenerator *lg;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_c0 [8];
  string uniqueName;
  cmLinkImplItem *l;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  string depString;
  string sep;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorTarget *target_local;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries_local;
  string *linkedTargetsContent;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(depString.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  __end0 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(libraries);
  l = (cmLinkImplItem *)std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(libraries)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                     *)&l), bVar1) {
    uniqueName.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
         ::operator*(&__end0);
    if (((((reference)uniqueName.field_2._8_8_)->super_cmLinkItem).Target !=
         (cmGeneratorTarget *)0x0) &&
       ((((reference)uniqueName.field_2._8_8_)->super_cmLinkItem).Target != target)) {
      this = cmGeneratorTarget::GetGlobalGenerator(target);
      cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                ((string *)local_c0,this,*(cmGeneratorTarget **)(uniqueName.field_2._8_8_ + 0x20));
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&depString.field_2 + 8),"$<TARGET_PROPERTY:");
      std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::operator+(&local_130,&local_150,",");
      std::operator+(&local_110,&local_130,interfacePropertyName);
      std::operator+(&local_f0,&local_110,">");
      std::__cxx11::string::operator+=((string *)&__range1,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::operator=((string *)(depString.field_2._M_local_buf + 8),";");
      std::__cxx11::string::~string((string *)local_c0);
    }
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&__end0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_190,(string *)&__range1,lg,context,headTarget,target,dagChecker);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
  }
  cmGeneratorExpression::StripEmptyListElements(&local_1b0,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)(depString.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (T const& l : libraries) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (l.Target && l.Target != target) {
      std::string uniqueName =
        target->GetGlobalGenerator()->IndexGeneratorTargetUniquely(l.Target);
      depString += sep + "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}